

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O0

void __thiscall
cmDependsC::cmDependsC
          (cmDependsC *this,cmLocalUnixMakefileGenerator3 *lg,string *targetDir,string *lang,
          DependencyMap *validDeps)

{
  bool bVar1;
  string *psVar2;
  cmAlphaNum local_348;
  cmAlphaNum local_318;
  string local_2e8;
  cmAlphaNum local_2c8;
  cmAlphaNum local_298;
  string local_268;
  cmAlphaNum local_248;
  cmAlphaNum local_218;
  string local_1e8;
  cmValue local_1c8;
  cmValue cr;
  cmAlphaNum local_190;
  undefined1 local_160 [8];
  string complainRegexVar;
  cmValue sr;
  cmAlphaNum local_108;
  undefined1 local_d8 [8];
  string scanRegexVar;
  undefined1 local_b0 [8];
  string complainRegex;
  undefined1 local_88 [8];
  string scanRegex;
  cmMakefile *mf;
  string local_50;
  DependencyMap *local_30;
  DependencyMap *validDeps_local;
  string *lang_local;
  string *targetDir_local;
  cmLocalUnixMakefileGenerator3 *lg_local;
  cmDependsC *this_local;
  
  local_30 = validDeps;
  validDeps_local = (DependencyMap *)lang;
  lang_local = targetDir;
  targetDir_local = (string *)lg;
  lg_local = (cmLocalUnixMakefileGenerator3 *)this;
  std::__cxx11::string::string((string *)&local_50,(string *)targetDir);
  cmDepends::cmDepends(&this->super_cmDepends,lg,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_cmDepends)._vptr_cmDepends = (_func_int **)&PTR__cmDependsC_011ca2c8;
  cmsys::RegularExpression::RegularExpression(&this->IncludeRegexLine);
  cmsys::RegularExpression::RegularExpression(&this->IncludeRegexScan);
  cmsys::RegularExpression::RegularExpression(&this->IncludeRegexComplain);
  std::__cxx11::string::string((string *)&this->IncludeRegexLineString);
  std::__cxx11::string::string((string *)&this->IncludeRegexScanString);
  std::__cxx11::string::string((string *)&this->IncludeRegexComplainString);
  std::__cxx11::string::string((string *)&this->IncludeRegexTransformString);
  cmsys::RegularExpression::RegularExpression(&this->IncludeRegexTransform);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->TransformRules);
  this->ValidDeps = local_30;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->Encountered);
  std::
  queue<cmDependsC::UnscannedEntry,std::deque<cmDependsC::UnscannedEntry,std::allocator<cmDependsC::UnscannedEntry>>>
  ::queue<std::deque<cmDependsC::UnscannedEntry,std::allocator<cmDependsC::UnscannedEntry>>,void>
            ((queue<cmDependsC::UnscannedEntry,std::deque<cmDependsC::UnscannedEntry,std::allocator<cmDependsC::UnscannedEntry>>>
              *)&this->Unscanned);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines>_>_>
  ::map(&this->FileCache);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->HeaderLocationCache);
  std::__cxx11::string::string((string *)&this->CacheFileName);
  scanRegex.field_2._8_8_ = cmLocalGenerator::GetMakefile((cmLocalGenerator *)targetDir_local);
  cmDepends::SetIncludePathFromLanguage(&this->super_cmDepends,(string *)validDeps_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_88,"^.*$",(allocator<char> *)(complainRegex.field_2._M_local_buf + 0xf)
            );
  std::allocator<char>::~allocator((allocator<char> *)(complainRegex.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,"^$",(allocator<char> *)(scanRegexVar.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(scanRegexVar.field_2._M_local_buf + 0xf));
  cmAlphaNum::cmAlphaNum(&local_108,"CMAKE_");
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&sr,(string *)validDeps_local);
  cmStrCat<char[20]>((string *)local_d8,&local_108,(cmAlphaNum *)&sr,
                     (char (*) [20])"_INCLUDE_REGEX_SCAN");
  complainRegexVar.field_2._8_8_ =
       (size_type)cmMakefile::GetDefinition(scanRegex.field_2._8_8_,(string *)local_d8);
  bVar1 = cmValue::operator_cast_to_bool((cmValue *)((long)&complainRegexVar.field_2 + 8));
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&complainRegexVar.field_2 + 8));
    std::__cxx11::string::operator=((string *)local_88,(string *)psVar2);
  }
  cmAlphaNum::cmAlphaNum(&local_190,"CMAKE_");
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&cr,(string *)validDeps_local);
  cmStrCat<char[24]>((string *)local_160,&local_190,(cmAlphaNum *)&cr,
                     (char (*) [24])"_INCLUDE_REGEX_COMPLAIN");
  local_1c8 = cmMakefile::GetDefinition((cmMakefile *)scanRegex.field_2._8_8_,(string *)local_160);
  bVar1 = cmValue::operator_cast_to_bool(&local_1c8);
  if (bVar1) {
    psVar2 = cmValue::operator*[abi_cxx11_(&local_1c8);
    std::__cxx11::string::operator=((string *)local_b0,(string *)psVar2);
  }
  std::__cxx11::string::~string((string *)local_160);
  std::__cxx11::string::~string((string *)local_d8);
  cmsys::RegularExpression::compile
            (&this->IncludeRegexLine,"^[ \t]*[#%][ \t]*(include|import)[ \t]*[<\"]([^\">]+)([\">])")
  ;
  cmsys::RegularExpression::compile(&this->IncludeRegexScan,(string *)local_88);
  cmsys::RegularExpression::compile(&this->IncludeRegexComplain,(string *)local_b0);
  std::__cxx11::string::operator=
            ((string *)&this->IncludeRegexLineString,
             "#IncludeRegexLine: ^[ \t]*[#%][ \t]*(include|import)[ \t]*[<\"]([^\">]+)([\">])");
  cmAlphaNum::cmAlphaNum(&local_218,"#IncludeRegexScan: ");
  cmAlphaNum::cmAlphaNum(&local_248,(string *)local_88);
  cmStrCat<>(&local_1e8,&local_218,&local_248);
  std::__cxx11::string::operator=((string *)&this->IncludeRegexScanString,(string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  cmAlphaNum::cmAlphaNum(&local_298,"#IncludeRegexComplain: ");
  cmAlphaNum::cmAlphaNum(&local_2c8,(string *)local_b0);
  cmStrCat<>(&local_268,&local_298,&local_2c8);
  std::__cxx11::string::operator=((string *)&this->IncludeRegexComplainString,(string *)&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  SetupTransforms(this);
  cmAlphaNum::cmAlphaNum(&local_318,&(this->super_cmDepends).TargetDirectory);
  cmAlphaNum::cmAlphaNum(&local_348,'/');
  cmStrCat<std::__cxx11::string,char[14]>
            (&local_2e8,&local_318,&local_348,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)validDeps_local,
             (char (*) [14])".includecache");
  std::__cxx11::string::operator=((string *)&this->CacheFileName,(string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2e8);
  ReadCacheFile(this);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_88);
  return;
}

Assistant:

cmDependsC::cmDependsC(cmLocalUnixMakefileGenerator3* lg,
                       const std::string& targetDir, const std::string& lang,
                       const DependencyMap* validDeps)
  : cmDepends(lg, targetDir)
  , ValidDeps(validDeps)
{
  cmMakefile* mf = lg->GetMakefile();

  // Configure the include file search path.
  this->SetIncludePathFromLanguage(lang);

  // Configure regular expressions.
  std::string scanRegex = "^.*$";
  std::string complainRegex = "^$";
  {
    std::string scanRegexVar = cmStrCat("CMAKE_", lang, "_INCLUDE_REGEX_SCAN");
    if (cmValue sr = mf->GetDefinition(scanRegexVar)) {
      scanRegex = *sr;
    }
    std::string complainRegexVar =
      cmStrCat("CMAKE_", lang, "_INCLUDE_REGEX_COMPLAIN");
    if (cmValue cr = mf->GetDefinition(complainRegexVar)) {
      complainRegex = *cr;
    }
  }

  this->IncludeRegexLine.compile(INCLUDE_REGEX_LINE);
  this->IncludeRegexScan.compile(scanRegex);
  this->IncludeRegexComplain.compile(complainRegex);
  this->IncludeRegexLineString = INCLUDE_REGEX_LINE_MARKER INCLUDE_REGEX_LINE;
  this->IncludeRegexScanString =
    cmStrCat(INCLUDE_REGEX_SCAN_MARKER, scanRegex);
  this->IncludeRegexComplainString =
    cmStrCat(INCLUDE_REGEX_COMPLAIN_MARKER, complainRegex);

  this->SetupTransforms();

  this->CacheFileName =
    cmStrCat(this->TargetDirectory, '/', lang, ".includecache");

  this->ReadCacheFile();
}